

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

Gia_Man_t * Abc_GenSignedBoothPPTest(int nArgA,int nArgB)

{
  Gia_Man_t *p;
  int iVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar2 = (char *)0x3e8;
  p = Gia_ManStart(1000);
  pcVar2 = Abc_UtilStrsav(pcVar2);
  p->pName = pcVar2;
  iVar1 = 5;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    Gia_ManAppendCi(p);
  }
  iVar1 = Abc_GenSignedBoothPP(p,2,4,6,8,10);
  Gia_ManAppendCo(p,iVar1);
  return p;
}

Assistant:

Gia_Man_t * Abc_GenSignedBoothPPTest( int nArgA, int nArgB )
{
    Gia_Man_t * pNew; int i, iLit;
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "booth" );
    for ( i = 0; i < 5; i++ )
         Gia_ManAppendCi(pNew);
    iLit = Abc_GenSignedBoothPP( pNew, 2, 4, 6, 8, 10 );
    Gia_ManAppendCo(pNew, iLit);
    return pNew;
}